

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Command.cpp
# Opt level: O1

void __thiscall
GenericCommandWrapperIRCCommand::trigger
          (GenericCommandWrapperIRCCommand *this,IRC_Bot *source,string_view in_channel,
          string_view in_nick,string_view in_parameters)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  size_t sVar5;
  undefined8 uVar6;
  
  puVar2 = (undefined8 *)
           (**(code **)(*(long *)this->m_command + 0x18))
                     (this->m_command,in_parameters._M_len,in_parameters._M_str);
  do {
    if (puVar2 == (undefined8 *)0x0) {
      return;
    }
    switch(*(undefined4 *)(puVar2 + 4)) {
    case 0:
    case 2:
      uVar6 = *puVar2;
      uVar3 = puVar2[1];
      pcVar4 = in_channel._M_str;
      sVar5 = in_channel._M_len;
      break;
    case 1:
    case 3:
      Jupiter::IRC::Client::sendNotice(source,in_nick._M_len,in_nick._M_str,puVar2[1],*puVar2);
      goto LAB_0010c5bf;
    default:
      uVar6 = *puVar2;
      uVar3 = puVar2[1];
      pcVar4 = in_nick._M_str;
      sVar5 = in_nick._M_len;
    }
    Jupiter::IRC::Client::sendMessage(source,sVar5,pcVar4,uVar3,uVar6);
LAB_0010c5bf:
    puVar1 = (undefined8 *)puVar2[5];
    if ((long *)*puVar2 != puVar2 + 2) {
      operator_delete((long *)*puVar2,puVar2[2] + 1);
    }
    operator_delete(puVar2,0x30);
    puVar2 = puVar1;
  } while( true );
}

Assistant:

void GenericCommandWrapperIRCCommand::trigger(IRC_Bot *source, std::string_view in_channel, std::string_view in_nick, std::string_view in_parameters) {
	Jupiter::GenericCommand::ResponseLine *del;
	Jupiter::GenericCommand::ResponseLine *result = m_command->trigger(in_parameters);

	while (result != nullptr)
	{
		switch (result->type)
		{
		case Jupiter::GenericCommand::DisplayType::PublicSuccess:
		case Jupiter::GenericCommand::DisplayType::PublicError:
			source->sendMessage(in_channel, result->response);
			break;
		case Jupiter::GenericCommand::DisplayType::PrivateSuccess:
		case Jupiter::GenericCommand::DisplayType::PrivateError:
			source->sendNotice(in_nick, result->response);
			break;
		default:
			source->sendMessage(in_nick, result->response);
			break;
		}

		del = result;
		result = result->next;
		delete del;
	}
}